

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

TokenOrSyntax * __thiscall
slang::syntax::CoverCrossSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,CoverCrossSyntax *this,size_t index)

{
  CoverageIffClauseSyntax *pCVar1;
  SyntaxNode *pSVar2;
  Token local_20;
  
  switch(index) {
  case 0:
    pSVar2 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    goto LAB_003143b7;
  case 1:
    pCVar1 = (CoverageIffClauseSyntax *)this->label;
    goto LAB_003143a2;
  case 2:
    local_20.kind = (this->cross).kind;
    local_20._2_1_ = (this->cross).field_0x2;
    local_20.numFlags.raw = (this->cross).numFlags.raw;
    local_20.rawLen = (this->cross).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->cross).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->cross).info + 4);
    break;
  case 3:
    pSVar2 = &(this->items).super_SyntaxListBase.super_SyntaxNode;
    goto LAB_003143b7;
  case 4:
    pCVar1 = this->iff;
LAB_003143a2:
    *(CoverageIffClauseSyntax **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pCVar1;
    goto LAB_003143ba;
  case 5:
    local_20.kind = (this->openBrace).kind;
    local_20._2_1_ = (this->openBrace).field_0x2;
    local_20.numFlags.raw = (this->openBrace).numFlags.raw;
    local_20.rawLen = (this->openBrace).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->openBrace).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->openBrace).info + 4);
    break;
  case 6:
    pSVar2 = &(this->members).super_SyntaxListBase.super_SyntaxNode;
LAB_003143b7:
    *(SyntaxNode **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pSVar2;
LAB_003143ba:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\x01';
    return __return_storage_ptr__;
  case 7:
    local_20.kind = (this->closeBrace).kind;
    local_20._2_1_ = (this->closeBrace).field_0x2;
    local_20.numFlags.raw = (this->closeBrace).numFlags.raw;
    local_20.rawLen = (this->closeBrace).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->closeBrace).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->closeBrace).info + 4);
    break;
  case 8:
    local_20.kind = (this->emptySemi).kind;
    local_20._2_1_ = (this->emptySemi).field_0x2;
    local_20.numFlags.raw = (this->emptySemi).numFlags.raw;
    local_20.rawLen = (this->emptySemi).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->emptySemi).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->emptySemi).info + 4);
    break;
  default:
    parsing::Token::Token(&local_20);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
       local_20._0_4_;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 4) =
       local_20.rawLen;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8) =
       local_20.info._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0xc) =
       local_20.info._4_4_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\0';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax CoverCrossSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return label;
        case 2: return cross;
        case 3: return &items;
        case 4: return iff;
        case 5: return openBrace;
        case 6: return &members;
        case 7: return closeBrace;
        case 8: return emptySemi;
        default: return nullptr;
    }
}